

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O1

void Enum(void)

{
  double dVar1;
  pointer pvVar2;
  double *pdVar3;
  iterator __begin1;
  ostream *poVar4;
  pointer pdVar5;
  double *pdVar6;
  double *i_2;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *i;
  double *i_5;
  pointer pvVar11;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> expertopinion;
  vector<double,_std::allocator<double>_> result;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp;
  vector<double,_std::allocator<double>_> length;
  allocator_type local_e1;
  vector<double,_std::allocator<double>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_80;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_b0,&marks);
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_98,4);
  for (pvVar11 = local_b0.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = local_b0.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pvVar11 !=
      local_b0.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pvVar11 = pvVar11 + 1) {
    pdVar5 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar5;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 3;
      lVar8 = 0;
      do {
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar8] =
             pdVar5[lVar8] +
             local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
    }
  }
  for (; pvVar2 != local_b0.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
    pdVar5 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar5;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 3;
      lVar8 = 0;
      do {
        pdVar5[lVar8] =
             pdVar5[lVar8] /
             local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nNormalized Matrix\n",0x13);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_80,&local_b0);
  printMatrix(&local_80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_80);
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0x3ff0000000000000;
  local_58 = 0x3ff0000000000000;
  uStack_50 = 0x3ff0000000000000;
  local_68 = 1.0;
  uStack_60 = 0x3ff0000000000000;
  __l._M_len = 6;
  __l._M_array = &local_68;
  std::vector<double,_std::allocator<double>_>::vector(&local_e0,__l,(allocator_type *)&local_c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nExpert Asseessment of criteria:",0x20);
  pdVar5 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar6 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar5; pdVar6 = pdVar6 + 1) {
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 3;
    poVar4 = std::ostream::_M_insert<double>(*pdVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if ((*pdVar6 !=
         local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) ||
       (NAN(*pdVar6) ||
        NAN(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ; ",3);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_58 = 0x3ff0000000000000;
  uStack_50 = 0;
  local_68 = 3.0;
  uStack_60 = 0x4000000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&local_e0,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Criteria weights vector: ",0x19);
  pdVar5 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar6 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar5; pdVar6 = pdVar6 + 1) {
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 3;
    poVar4 = std::ostream::_M_insert<double>(*pdVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if ((*pdVar6 !=
         local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) ||
       (NAN(*pdVar6) ||
        NAN(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ; ",3);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  dVar1 = 0.0;
  for (pdVar6 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      pdVar6 != local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
    dVar1 = dVar1 + *pdVar6;
  }
  for (; pdVar5 != local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    *pdVar5 = *pdVar5 / dVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nNormalized Vector of Weights:    \t",0x23);
  pdVar5 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar6 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar5; pdVar6 = pdVar6 + 1) {
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 3;
    poVar4 = std::ostream::_M_insert<double>(*pdVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if ((*pdVar6 !=
         local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) ||
       (NAN(*pdVar6) ||
        NAN(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ; ",3);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0.0;
  uStack_60 = 0;
  __l_00._M_len = 4;
  __l_00._M_array = &local_68;
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,__l_00,&local_e1);
  if ((long)local_b0.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_b0.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar7 = ((long)local_b0.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b0.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar8 = 0;
    do {
      pdVar5 = local_b0.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar8].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar9 = (long)local_b0.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar8].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar5;
      if (lVar9 != 0) {
        lVar9 = lVar9 >> 3;
        dVar1 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        lVar10 = 0;
        do {
          dVar1 = dVar1 + pdVar5[lVar10] *
                          local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10];
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] = dVar1;
          lVar10 = lVar10 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nMatrix of values of the combined criterion:",0x2d);
  pdVar5 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar6 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar5; pdVar6 = pdVar6 + 1) {
    poVar4 = std::ostream::_M_insert<double>(*pdVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if ((*pdVar6 !=
         local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) ||
       (NAN(*pdVar6) ||
        NAN(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ; ",3);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  pdVar6 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  pdVar5 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar6 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish &&
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      pdVar3 = pdVar6;
      if (*pdVar6 < *pdVar5 || *pdVar6 == *pdVar5) {
        pdVar3 = pdVar5;
      }
      pdVar5 = pdVar3;
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nHighest Value = ",0x11);
  std::ostream::_M_insert<double>(*pdVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nBest choice is: ",0x11);
  cars((int)((ulong)((long)pdVar5 -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3));
  pvVar11 = local_b0.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_b0.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b0.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pdVar5 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar5 != (pointer)0x0) {
        operator_delete(pdVar5,(long)(pvVar11->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pdVar5);
      }
      pvVar11 = pvVar11 + 1;
    } while (pvVar11 !=
             local_b0.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    local_b0.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b0.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_b0);
  return;
}

Assistant:

void Enum(){
    vector<vector<double>> temp(marks);
    vector<double> length;
    vector<double>::iterator res;
    length.resize(4);
    for(auto &i:temp){
        for(size_t j=0;j<i.size();j++)
            length[j]+=i[j];
    }
    for(auto &i:temp){
        for(size_t j=0;j<i.size();j++)
            i[j] /= length[j];
    }

    cout << "\nNormalized Matrix\n";
    printMatrix(temp);


    vector<double> expertopinion={1,1,1,1,1,1};
    cout << "\nExpert Asseessment of criteria:";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i!=expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    expertopinion={3,2,1,0};
    cout << "Criteria weights vector: ";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i != expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    normalize(expertopinion);
    cout << "\nNormalized Vector of Weights:    \t";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i != expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    vector<double> result={0,0,0,0};
    for(size_t i=0;i<temp.size();i++){
        for(size_t j=0;j<temp[i].size();j++)
            result[i]+=temp[i][j]*expertopinion[j];
    }

    cout << "\n\nMatrix of values of the combined criterion:";
    for(const auto &i:result){
        cout << i << " ";
        if(i!=result[result.size()-1])
            cout << " ; ";
    }
    cout << endl;

    res=max_element(result.begin(),result.end());
    cout << "\nHighest Value = " << result[distance(result.begin(),res)];
    cout << "\nBest choice is: ";
    cars(std::distance(result.begin(),res));

    temp.clear();
    length.clear();
    expertopinion.clear();
    result.clear();
}